

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::CheckTargetsForMissingSources(cmGlobalGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  reference ppcVar4;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_00;
  reference ppcVar5;
  char *val;
  reference config_00;
  ostream *poVar6;
  string *psVar7;
  cmake *this_01;
  bool local_2d9;
  undefined1 local_2d0 [16];
  string local_2c0;
  undefined1 local_2a0 [8];
  ostringstream e;
  string *config;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  string local_100;
  undefined1 local_e0 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  undefined1 local_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  allocator<char> local_79;
  string local_78;
  cmGeneratorTarget *local_58;
  cmGeneratorTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range2;
  cmLocalGenerator *localGen;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  bool failed;
  cmGlobalGenerator *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (&this->LocalGenerators);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                       (&this->LocalGenerators);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                *)&localGen);
    if (!bVar2) {
      return __range1._7_1_;
    }
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    this_00 = cmLocalGenerator::GetGeneratorTargets(*ppcVar4);
    __end2 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_00);
    target = (cmGeneratorTarget *)
             std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                       *)&target), bVar2) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end2);
      local_58 = *ppcVar5;
      TVar3 = cmGeneratorTarget::GetType(local_58);
      bVar2 = false;
      configs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      local_2d9 = true;
      if (TVar3 != GLOBAL_TARGET) {
        TVar3 = cmGeneratorTarget::GetType(local_58);
        local_2d9 = true;
        if (TVar3 != INTERFACE_LIBRARY) {
          TVar3 = cmGeneratorTarget::GetType(local_58);
          pcVar1 = local_58;
          local_2d9 = true;
          if (TVar3 != UTILITY) {
            std::allocator<char>::allocator();
            bVar2 = true;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,"ghs_integrity_app",&local_79);
            configs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
            val = cmGeneratorTarget::GetProperty(pcVar1,&local_78);
            local_2d9 = cmSystemTools::IsOn(val);
          }
        }
      }
      if ((configs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_78);
      }
      if (bVar2) {
        std::allocator<char>::~allocator(&local_79);
      }
      if (local_2d9 == false) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8);
        cmMakefile::GetConfigurations
                  ((string *)
                   &srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage,local_58->Makefile,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,true);
        std::__cxx11::string::~string
                  ((string *)
                   &srcs.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage);
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0);
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a8);
        pcVar1 = local_58;
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_100,"",(allocator<char> *)((long)&__range4 + 7));
          cmGeneratorTarget::GetSourceFiles
                    (pcVar1,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0,
                     &local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
        }
        else {
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a8);
          config = (string *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_a8);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&config), bVar2) {
            config_00 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&__end4);
            cmGeneratorTarget::GetSourceFiles
                      (local_58,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0,
                       config_00);
            bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0);
            if (bVar2) break;
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
        }
        bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                          ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          poVar6 = std::operator<<((ostream *)local_2a0,"No SOURCES given to target: ");
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_58);
          std::operator<<(poVar6,(string *)psVar7);
          this_01 = GetCMakeInstance(this);
          std::__cxx11::ostringstream::str();
          cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2d0);
          cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_2d0 + 0x10),
                              (cmListFileBacktrace *)local_2d0);
          cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_2d0);
          std::__cxx11::string::~string((string *)(local_2d0 + 0x10));
          __range1._7_1_ = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        }
        std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                  ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool cmGlobalGenerator::CheckTargetsForMissingSources() const
{
  bool failed = false;
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    for (cmGeneratorTarget* target : localGen->GetGeneratorTargets()) {
      if (target->GetType() == cmStateEnums::TargetType::GLOBAL_TARGET ||
          target->GetType() == cmStateEnums::TargetType::INTERFACE_LIBRARY ||
          target->GetType() == cmStateEnums::TargetType::UTILITY ||
          cmSystemTools::IsOn(target->GetProperty("ghs_integrity_app"))) {
        continue;
      }

      std::vector<std::string> configs;
      target->Makefile->GetConfigurations(configs);
      std::vector<cmSourceFile*> srcs;
      if (configs.empty()) {
        target->GetSourceFiles(srcs, "");
      } else {
        for (std::string const& config : configs) {
          target->GetSourceFiles(srcs, config);
          if (srcs.empty()) {
            break;
          }
        }
      }
      if (srcs.empty()) {
        std::ostringstream e;
        e << "No SOURCES given to target: " << target->GetName();
        this->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(), target->GetBacktrace());
        failed = true;
      }
    }
  }
  return failed;
}